

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaemonClient.cpp
# Opt level: O2

void __thiscall xmrig::DaemonClient::setState(DaemonClient *this,SocketState state)

{
  IClientListener *pIVar1;
  ulong uVar2;
  uint64_t timeout;
  
  if ((this->super_BaseClient).m_state != state) {
    (this->super_BaseClient).m_state = state;
    if (state == UnconnectedState) {
      (this->super_BaseClient).m_failures = -1;
      Timer::stop(this->m_timer);
      return;
    }
    if (state == ConnectedState) {
      (this->super_BaseClient).m_failures = 0;
      pIVar1 = (this->super_BaseClient).m_listener;
      (*pIVar1->_vptr_IClientListener[5])(pIVar1,this);
      uVar2 = (this->super_BaseClient).m_pool.m_pollInterval;
      timeout = 0x14;
      if (0x14 < uVar2) {
        timeout = uVar2;
      }
      Timer::start(this->m_timer,timeout,timeout);
      return;
    }
  }
  return;
}

Assistant:

void xmrig::DaemonClient::setState(SocketState state)
{
    assert(m_state != state);
    if (m_state == state) {
        return;
    }

    m_state = state;

    switch (state) {
    case ConnectedState:
        {
            m_failures = 0;
            m_listener->onLoginSuccess(this);

            const uint64_t interval = std::max<uint64_t>(20, m_pool.pollInterval());
            m_timer->start(interval, interval);
        }
        break;

    case UnconnectedState:
        m_failures = -1;
        m_timer->stop();
        break;

    default:
        break;
    }
}